

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

Am_Object get_selection_widget(Am_Value *v)

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Value *in_RSI;
  undefined1 local_30 [8];
  Am_Value_List v_list;
  Am_Value *last_user;
  Am_Value *v_local;
  Am_Object *item;
  
  bVar1 = Am_Value_List::Test(in_RSI);
  if (bVar1) {
    v_list.item = (Am_List_Item *)Am_Object::Get(&Am_Screen,499,0);
    Am_Value_List::Am_Value_List((Am_Value_List *)local_30,in_RSI);
    Am_Value_List::Start((Am_Value_List *)local_30);
    while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_30), ((bVar1 ^ 0xffU) & 1) != 0) {
      bVar1 = false;
      pAVar3 = Am_Value_List::Get((Am_Value_List *)local_30);
      Am_Object::Am_Object((Am_Object *)v,pAVar3);
      bVar2 = Am_Object::Valid((Am_Object *)v);
      if (bVar2) {
        pAVar3 = Am_Object::Get((Am_Object *)v,0x1f1,0);
        bVar2 = Am_Value::operator==(pAVar3,&(v_list.item)->super_Am_Value);
        if (!bVar2) goto LAB_003144cb;
        bVar1 = true;
        bVar2 = true;
      }
      else {
LAB_003144cb:
        bVar2 = false;
      }
      if (!bVar1) {
        Am_Object::~Am_Object((Am_Object *)v);
      }
      if (bVar2) goto LAB_00314515;
      Am_Value_List::Next((Am_Value_List *)local_30);
    }
    Am_Object::Am_Object((Am_Object *)v,&Am_No_Object);
LAB_00314515:
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_30);
  }
  else {
    Am_Object::Am_Object((Am_Object *)v,in_RSI);
  }
  return (Am_Object)(Am_Object_Data *)v;
}

Assistant:

static Am_Object
get_selection_widget(const Am_Value v)
{
  if (!(Am_Value_List::Test(v)))
    return v;
  else {
    const Am_Value& last_user = Am_Screen.Get(Am_LAST_USER_ID);
    Am_Value_List v_list = v;
    for (v_list.Start(); !v_list.Last(); v_list.Next()) {
      Am_Object item = v_list.Get();
      if (item.Valid() && item.Get(Am_USER_ID) == last_user)
        return item;
    }
    return Am_No_Object;
  }
}